

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint __thiscall llvm::dwarf::getLanguage(dwarf *this,StringRef LanguageString)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pcVar4 = LanguageString.Data;
  switch(pcVar4) {
  case (char *)0x9:
    if (this[8] == (dwarf)0x43 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 2;
    }
    else {
      if (this[8] != (dwarf)0x44 || *(long *)this != 0x5f474e414c5f5744) {
        return 0;
      }
      uVar3 = 0x13;
    }
    break;
  default:
    uVar2 = (ulong)(pcVar4 + -10) >> 1;
    if ((uVar2 | (ulong)(((ulong)(pcVar4 + -10) & 1) != 0) << 0x3f) < 7) {
      uVar3 = (*(code *)(&DAT_00e50bf4 + *(int *)(&DAT_00e50bf4 + uVar2 * 4)))
                        (this,pcVar4,LanguageString.Length);
      return uVar3;
    }
    uVar3 = 0;
    switch(pcVar4) {
    case (char *)0xb:
      goto switchD_00d40a32_caseD_b;
    case (char *)0xc:
      if (*(int *)(this + 8) != 0x74737552 || *(long *)this != 0x5f474e414c5f5744) {
        return 0;
      }
      uVar3 = 0x1c;
      break;
    case (char *)0xd:
      goto switchD_00d40a32_caseD_d;
    case (char *)0xe:
    case (char *)0xf:
    case (char *)0x10:
    case (char *)0x11:
    case (char *)0x12:
    case (char *)0x13:
    case (char *)0x15:
      break;
    case (char *)0x14:
      uVar1 = *(undefined4 *)(this + 0x10);
      auVar19[0] = -((char)uVar1 == 'r');
      auVar19[1] = -((char)((uint)uVar1 >> 8) == 'i');
      auVar19[2] = -((char)((uint)uVar1 >> 0x10) == 'p');
      auVar19[3] = -((char)((uint)uVar1 >> 0x18) == 't');
      auVar19[4] = 0xff;
      auVar19[5] = 0xff;
      auVar19[6] = 0xff;
      auVar19[7] = 0xff;
      auVar19[8] = 0xff;
      auVar19[9] = 0xff;
      auVar19[10] = 0xff;
      auVar19[0xb] = 0xff;
      auVar19[0xc] = 0xff;
      auVar19[0xd] = 0xff;
      auVar19[0xe] = 0xff;
      auVar19[0xf] = 0xff;
      auVar12[0] = -(*this == (dwarf)'D');
      auVar12[1] = -(this[1] == (dwarf)'W');
      auVar12[2] = -(this[2] == (dwarf)'_');
      auVar12[3] = -(this[3] == (dwarf)'L');
      auVar12[4] = -(this[4] == (dwarf)'A');
      auVar12[5] = -(this[5] == (dwarf)'N');
      auVar12[6] = -(this[6] == (dwarf)'G');
      auVar12[7] = -(this[7] == (dwarf)'_');
      auVar12[8] = -(this[8] == (dwarf)'R');
      auVar12[9] = -(this[9] == (dwarf)'e');
      auVar12[10] = -(this[10] == (dwarf)'n');
      auVar12[0xb] = -(this[0xb] == (dwarf)'d');
      auVar12[0xc] = -(this[0xc] == (dwarf)'e');
      auVar12[0xd] = -(this[0xd] == (dwarf)'r');
      auVar12[0xe] = -(this[0xe] == (dwarf)'S');
      auVar12[0xf] = -(this[0xf] == (dwarf)'c');
      auVar12 = auVar12 & auVar19;
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) {
        return 0;
      }
      uVar3 = 0x24;
      break;
    case (char *)0x16:
      auVar17[0] = -(this[6] == (dwarf)'G');
      auVar17[1] = -(this[7] == (dwarf)'_');
      auVar17[2] = -(this[8] == (dwarf)'C');
      auVar17[3] = -(this[9] == (dwarf)'_');
      auVar17[4] = -(this[10] == (dwarf)'p');
      auVar17[5] = -(this[0xb] == (dwarf)'l');
      auVar17[6] = -(this[0xc] == (dwarf)'u');
      auVar17[7] = -(this[0xd] == (dwarf)'s');
      auVar17[8] = -(this[0xe] == (dwarf)'_');
      auVar17[9] = -(this[0xf] == (dwarf)'p');
      auVar17[10] = -(this[0x10] == (dwarf)'l');
      auVar17[0xb] = -(this[0x11] == (dwarf)'u');
      auVar17[0xc] = -(this[0x12] == (dwarf)'s');
      auVar17[0xd] = -(this[0x13] == (dwarf)'_');
      auVar17[0xe] = -(this[0x14] == (dwarf)'1');
      auVar17[0xf] = -(this[0x15] == (dwarf)'4');
      auVar10[0] = -(*this == (dwarf)'D');
      auVar10[1] = -(this[1] == (dwarf)'W');
      auVar10[2] = -(this[2] == (dwarf)'_');
      auVar10[3] = -(this[3] == (dwarf)'L');
      auVar10[4] = -(this[4] == (dwarf)'A');
      auVar10[5] = -(this[5] == (dwarf)'N');
      auVar10[6] = -(this[6] == (dwarf)'G');
      auVar10[7] = -(this[7] == (dwarf)'_');
      auVar10[8] = -(this[8] == (dwarf)'C');
      auVar10[9] = -(this[9] == (dwarf)'_');
      auVar10[10] = -(this[10] == (dwarf)'p');
      auVar10[0xb] = -(this[0xb] == (dwarf)'l');
      auVar10[0xc] = -(this[0xc] == (dwarf)'u');
      auVar10[0xd] = -(this[0xd] == (dwarf)'s');
      auVar10[0xe] = -(this[0xe] == (dwarf)'_');
      auVar10[0xf] = -(this[0xf] == (dwarf)'p');
      auVar10 = auVar10 & auVar17;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        return 0x21;
      }
      auVar18[0] = -(this[6] == (dwarf)'G');
      auVar18[1] = -(this[7] == (dwarf)'_');
      auVar18[2] = -(this[8] == (dwarf)'M');
      auVar18[3] = -(this[9] == (dwarf)'i');
      auVar18[4] = -(this[10] == (dwarf)'p');
      auVar18[5] = -(this[0xb] == (dwarf)'s');
      auVar18[6] = -(this[0xc] == (dwarf)'_');
      auVar18[7] = -(this[0xd] == (dwarf)'A');
      auVar18[8] = -(this[0xe] == (dwarf)'s');
      auVar18[9] = -(this[0xf] == (dwarf)'s');
      auVar18[10] = -(this[0x10] == (dwarf)'e');
      auVar18[0xb] = -(this[0x11] == (dwarf)'m');
      auVar18[0xc] = -(this[0x12] == (dwarf)'b');
      auVar18[0xd] = -(this[0x13] == (dwarf)'l');
      auVar18[0xe] = -(this[0x14] == (dwarf)'e');
      auVar18[0xf] = -(this[0x15] == (dwarf)'r');
      auVar11[0] = -(*this == (dwarf)'D');
      auVar11[1] = -(this[1] == (dwarf)'W');
      auVar11[2] = -(this[2] == (dwarf)'_');
      auVar11[3] = -(this[3] == (dwarf)'L');
      auVar11[4] = -(this[4] == (dwarf)'A');
      auVar11[5] = -(this[5] == (dwarf)'N');
      auVar11[6] = -(this[6] == (dwarf)'G');
      auVar11[7] = -(this[7] == (dwarf)'_');
      auVar11[8] = -(this[8] == (dwarf)'M');
      auVar11[9] = -(this[9] == (dwarf)'i');
      auVar11[10] = -(this[10] == (dwarf)'p');
      auVar11[0xb] = -(this[0xb] == (dwarf)'s');
      auVar11[0xc] = -(this[0xc] == (dwarf)'_');
      auVar11[0xd] = -(this[0xd] == (dwarf)'A');
      auVar11[0xe] = -(this[0xe] == (dwarf)'s');
      auVar11[0xf] = -(this[0xf] == (dwarf)'s');
      auVar11 = auVar11 & auVar18;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
        return 0x8001;
      }
      bVar5 = (*(long *)(this + 0xe) == 0x6968706c65445f44 &&
              *(long *)(this + 8) == 0x5f444e414c524f42) &&
              (*(long *)(this + 6) == 0x4e414c524f425f47 && *(long *)this == 0x5f474e414c5f5744);
      uVar3 = 0xb000;
      goto LAB_00d40d58;
    default:
      if (pcVar4 != (char *)0x1b) {
        return 0;
      }
      bVar5 = (*(long *)(this + 0x13) == 0x7470697263537265 &&
              *(long *)(this + 8) == 0x525f454c474f4f47) &&
              (*(long *)(this + 0xb) == 0x646e65525f454c47 && *(long *)this == 0x5f474e414c5f5744);
      uVar3 = 0x8e57;
LAB_00d40d58:
      if (!bVar5) {
        return 0;
      }
    }
    break;
  case (char *)0xb:
    if (*(long *)(this + 3) == 0x3938435f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      return 1;
    }
    if (*(long *)(this + 3) == 0x3939435f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      return 0xc;
    }
    if (*(long *)(this + 3) == 0x494c505f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      return 0xf;
    }
    if (*(long *)(this + 3) == 0x4350555f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      return 0x12;
    }
switchD_00d40a32_caseD_b:
    if (*(long *)(this + 3) != 0x3131435f474e414c || *(long *)this != 0x5f474e414c5f5744) {
      return 0;
    }
    uVar3 = 0x1d;
    break;
  case (char *)0xd:
    if (*(long *)(this + 5) == 0x33386164415f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 3;
    }
    if (*(long *)(this + 5) == 0x35396164415f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 0xd;
    }
    if (*(long *)(this + 5) == 0x6c6d61434f5f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 0x1b;
    }
    if (*(long *)(this + 5) == 0x74666977535f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 0x1e;
    }
    if (*(long *)(this + 5) == 0x61696c754a5f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 0x1f;
    }
    if (*(long *)(this + 5) == 0x6e616c79445f474e && *(long *)this == 0x5f474e414c5f5744) {
      return 0x20;
    }
switchD_00d40a32_caseD_d:
    if (*(long *)(this + 5) != 0x5353494c425f474e || *(long *)this != 0x5f474e414c5f5744) {
      return 0;
    }
    return 0x25;
  case (char *)0xf:
    if (*(long *)(this + 7) == 0x34376c6f626f435f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 5;
    }
    else if (*(long *)(this + 7) == 0x35386c6f626f435f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 6;
    }
    else if (*(long *)(this + 7) == 0x32616c75646f4d5f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 10;
    }
    else if (*(long *)(this + 7) == 0x33616c75646f4d5f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x17;
    }
    else {
      if (*(long *)(this + 7) != 0x6c6c656b7361485f || *(long *)this != 0x5f474e414c5f5744) {
        return 0;
      }
      uVar3 = 0x18;
    }
    break;
  case (char *)0x11:
    auVar7[0] = -(*this == (dwarf)'D');
    auVar7[1] = -(this[1] == (dwarf)'W');
    auVar7[2] = -(this[2] == (dwarf)'_');
    auVar7[3] = -(this[3] == (dwarf)'L');
    auVar7[4] = -(this[4] == (dwarf)'A');
    auVar7[5] = -(this[5] == (dwarf)'N');
    auVar7[6] = -(this[6] == (dwarf)'G');
    auVar7[7] = -(this[7] == (dwarf)'_');
    auVar7[8] = -(this[8] == (dwarf)'F');
    auVar7[9] = -(this[9] == (dwarf)'o');
    auVar7[10] = -(this[10] == (dwarf)'r');
    auVar7[0xb] = -(this[0xb] == (dwarf)'t');
    auVar7[0xc] = -(this[0xc] == (dwarf)'r');
    auVar7[0xd] = -(this[0xd] == (dwarf)'a');
    auVar7[0xe] = -(this[0xe] == (dwarf)'n');
    auVar7[0xf] = -(this[0xf] == (dwarf)'7');
    auVar14[0] = -(this[0x10] == (dwarf)'7');
    auVar14[1] = 0xff;
    auVar14[2] = 0xff;
    auVar14[3] = 0xff;
    auVar14[4] = 0xff;
    auVar14[5] = 0xff;
    auVar14[6] = 0xff;
    auVar14[7] = 0xff;
    auVar14[8] = 0xff;
    auVar14[9] = 0xff;
    auVar14[10] = 0xff;
    auVar14[0xb] = 0xff;
    auVar14[0xc] = 0xff;
    auVar14[0xd] = 0xff;
    auVar14[0xe] = 0xff;
    auVar14[0xf] = 0xff;
    auVar14 = auVar14 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
      uVar3 = 7;
    }
    else {
      auVar8[0] = -(*this == (dwarf)'D');
      auVar8[1] = -(this[1] == (dwarf)'W');
      auVar8[2] = -(this[2] == (dwarf)'_');
      auVar8[3] = -(this[3] == (dwarf)'L');
      auVar8[4] = -(this[4] == (dwarf)'A');
      auVar8[5] = -(this[5] == (dwarf)'N');
      auVar8[6] = -(this[6] == (dwarf)'G');
      auVar8[7] = -(this[7] == (dwarf)'_');
      auVar8[8] = -(this[8] == (dwarf)'F');
      auVar8[9] = -(this[9] == (dwarf)'o');
      auVar8[10] = -(this[10] == (dwarf)'r');
      auVar8[0xb] = -(this[0xb] == (dwarf)'t');
      auVar8[0xc] = -(this[0xc] == (dwarf)'r');
      auVar8[0xd] = -(this[0xd] == (dwarf)'a');
      auVar8[0xe] = -(this[0xe] == (dwarf)'n');
      auVar8[0xf] = -(this[0xf] == (dwarf)'9');
      auVar15[0] = -(this[0x10] == (dwarf)'0');
      auVar15[1] = 0xff;
      auVar15[2] = 0xff;
      auVar15[3] = 0xff;
      auVar15[4] = 0xff;
      auVar15[5] = 0xff;
      auVar15[6] = 0xff;
      auVar15[7] = 0xff;
      auVar15[8] = 0xff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      auVar15 = auVar15 & auVar8;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        uVar3 = 8;
      }
      else {
        auVar20[0] = -(this[0x10] == (dwarf)0x35);
        auVar20[1] = 0xff;
        auVar20[2] = 0xff;
        auVar20[3] = 0xff;
        auVar20[4] = 0xff;
        auVar20[5] = 0xff;
        auVar20[6] = 0xff;
        auVar20[7] = 0xff;
        auVar20[8] = 0xff;
        auVar20[9] = 0xff;
        auVar20[10] = 0xff;
        auVar20[0xb] = 0xff;
        auVar20[0xc] = 0xff;
        auVar20[0xd] = 0xff;
        auVar20[0xe] = 0xff;
        auVar20[0xf] = 0xff;
        auVar23[0] = -(*this == (dwarf)0x44);
        auVar23[1] = -(this[1] == (dwarf)0x57);
        auVar23[2] = -(this[2] == (dwarf)0x5f);
        auVar23[3] = -(this[3] == (dwarf)0x4c);
        auVar23[4] = -(this[4] == (dwarf)0x41);
        auVar23[5] = -(this[5] == (dwarf)0x4e);
        auVar23[6] = -(this[6] == (dwarf)0x47);
        auVar23[7] = -(this[7] == (dwarf)0x5f);
        auVar23[8] = -(this[8] == (dwarf)0x46);
        auVar23[9] = -(this[9] == (dwarf)0x6f);
        auVar23[10] = -(this[10] == (dwarf)0x72);
        auVar23[0xb] = -(this[0xb] == (dwarf)0x74);
        auVar23[0xc] = -(this[0xc] == (dwarf)0x72);
        auVar23[0xd] = -(this[0xd] == (dwarf)0x61);
        auVar23[0xe] = -(this[0xe] == (dwarf)0x6e);
        auVar23[0xf] = -(this[0xf] == (dwarf)0x39);
        auVar20 = auVar20 & auVar23;
        if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
          uVar3 = 0xe;
        }
        else {
          auVar16[0] = -(*this == (dwarf)'D');
          auVar16[1] = -(this[1] == (dwarf)'W');
          auVar16[2] = -(this[2] == (dwarf)'_');
          auVar16[3] = -(this[3] == (dwarf)'L');
          auVar16[4] = -(this[4] == (dwarf)'A');
          auVar16[5] = -(this[5] == (dwarf)'N');
          auVar16[6] = -(this[6] == (dwarf)'G');
          auVar16[7] = -(this[7] == (dwarf)'_');
          auVar16[8] = -(this[8] == (dwarf)'F');
          auVar16[9] = -(this[9] == (dwarf)'o');
          auVar16[10] = -(this[10] == (dwarf)'r');
          auVar16[0xb] = -(this[0xb] == (dwarf)'t');
          auVar16[0xc] = -(this[0xc] == (dwarf)'r');
          auVar16[0xd] = -(this[0xd] == (dwarf)'a');
          auVar16[0xe] = -(this[0xe] == (dwarf)'n');
          auVar16[0xf] = -(this[0xf] == (dwarf)'0');
          auVar21[0] = -(this[0x10] == (dwarf)'3');
          auVar21[1] = 0xff;
          auVar21[2] = 0xff;
          auVar21[3] = 0xff;
          auVar21[4] = 0xff;
          auVar21[5] = 0xff;
          auVar21[6] = 0xff;
          auVar21[7] = 0xff;
          auVar21[8] = 0xff;
          auVar21[9] = 0xff;
          auVar21[10] = 0xff;
          auVar21[0xb] = 0xff;
          auVar21[0xc] = 0xff;
          auVar21[0xd] = 0xff;
          auVar21[0xe] = 0xff;
          auVar21[0xf] = 0xff;
          auVar21 = auVar21 & auVar16;
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
            uVar3 = 0x22;
          }
          else {
            auVar22[0] = -(this[0x10] == (dwarf)'8');
            auVar22[1] = 0xff;
            auVar22[2] = 0xff;
            auVar22[3] = 0xff;
            auVar22[4] = 0xff;
            auVar22[5] = 0xff;
            auVar22[6] = 0xff;
            auVar22[7] = 0xff;
            auVar22[8] = 0xff;
            auVar22[9] = 0xff;
            auVar22[10] = 0xff;
            auVar22[0xb] = 0xff;
            auVar22[0xc] = 0xff;
            auVar22[0xd] = 0xff;
            auVar22[0xe] = 0xff;
            auVar22[0xf] = 0xff;
            auVar9[0] = -(*this == (dwarf)0x44);
            auVar9[1] = -(this[1] == (dwarf)0x57);
            auVar9[2] = -(this[2] == (dwarf)0x5f);
            auVar9[3] = -(this[3] == (dwarf)0x4c);
            auVar9[4] = -(this[4] == (dwarf)0x41);
            auVar9[5] = -(this[5] == (dwarf)0x4e);
            auVar9[6] = -(this[6] == (dwarf)0x47);
            auVar9[7] = -(this[7] == (dwarf)0x5f);
            auVar9[8] = -(this[8] == (dwarf)0x46);
            auVar9[9] = -(this[9] == (dwarf)0x6f);
            auVar9[10] = -(this[10] == (dwarf)0x72);
            auVar9[0xb] = -(this[0xb] == (dwarf)0x74);
            auVar9[0xc] = -(this[0xc] == (dwarf)0x72);
            auVar9[0xd] = -(this[0xd] == (dwarf)0x61);
            auVar9[0xe] = -(this[0xe] == (dwarf)0x6e);
            auVar9[0xf] = -(this[0xf] == (dwarf)0x30);
            auVar22 = auVar22 & auVar9;
            if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
              return 0;
            }
            uVar3 = 0x23;
          }
        }
      }
    }
    break;
  case (char *)0x13:
    auVar13[0] = -(this[3] == (dwarf)'L');
    auVar13[1] = -(this[4] == (dwarf)'A');
    auVar13[2] = -(this[5] == (dwarf)'N');
    auVar13[3] = -(this[6] == (dwarf)'G');
    auVar13[4] = -(this[7] == (dwarf)'_');
    auVar13[5] = -(this[8] == (dwarf)'C');
    auVar13[6] = -(this[9] == (dwarf)'_');
    auVar13[7] = -(this[10] == (dwarf)'p');
    auVar13[8] = -(this[0xb] == (dwarf)'l');
    auVar13[9] = -(this[0xc] == (dwarf)'u');
    auVar13[10] = -(this[0xd] == (dwarf)'s');
    auVar13[0xb] = -(this[0xe] == (dwarf)'_');
    auVar13[0xc] = -(this[0xf] == (dwarf)'p');
    auVar13[0xd] = -(this[0x10] == (dwarf)'l');
    auVar13[0xe] = -(this[0x11] == (dwarf)'u');
    auVar13[0xf] = -(this[0x12] == (dwarf)'s');
    auVar6[0] = -(*this == (dwarf)'D');
    auVar6[1] = -(this[1] == (dwarf)'W');
    auVar6[2] = -(this[2] == (dwarf)'_');
    auVar6[3] = -(this[3] == (dwarf)'L');
    auVar6[4] = -(this[4] == (dwarf)'A');
    auVar6[5] = -(this[5] == (dwarf)'N');
    auVar6[6] = -(this[6] == (dwarf)'G');
    auVar6[7] = -(this[7] == (dwarf)'_');
    auVar6[8] = -(this[8] == (dwarf)'C');
    auVar6[9] = -(this[9] == (dwarf)'_');
    auVar6[10] = -(this[10] == (dwarf)'p');
    auVar6[0xb] = -(this[0xb] == (dwarf)'l');
    auVar6[0xc] = -(this[0xc] == (dwarf)'u');
    auVar6[0xd] = -(this[0xd] == (dwarf)'s');
    auVar6[0xe] = -(this[0xe] == (dwarf)'_');
    auVar6[0xf] = -(this[0xf] == (dwarf)'p');
    auVar6 = auVar6 & auVar13;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      return 0;
    }
    return 4;
  }
  return uVar3;
}

Assistant:

unsigned llvm::dwarf::getLanguage(StringRef LanguageString) {
  return StringSwitch<unsigned>(LanguageString)
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  .Case("DW_LANG_" #NAME, DW_LANG_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}